

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QRect __thiscall QDockAreaLayout::itemRect(QDockAreaLayout *this,QList<int> *path)

{
  int iVar1;
  Data *pDVar2;
  CutResult CVar3;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  QRect QVar6;
  QRect QVar7;
  QArrayData *d;
  qsizetype l;
  qsizetype p;
  QList<int> local_58;
  qsizetype local_40;
  qsizetype local_38;
  long local_30;
  undefined8 uVar5;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  local_38 = 1;
  local_40 = -1;
  CVar3 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_38,&local_40);
  if (CVar3 < Full) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (int *)0x0;
    local_58.d.size = 0;
    QVar6 = QDockAreaLayoutInfo::itemRect(this->docks + iVar1,&local_58);
    uVar5 = QVar6._8_8_;
  }
  else {
    if (CVar3 == Full) {
      local_58.d.d = (path->d).d;
      local_58.d.ptr = (path->d).ptr;
      local_58.d.size = (path->d).size;
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr =
           (int *)QArrayData::allocate((QArrayData **)&local_58,4,0x10,local_40,KeepSize);
      local_58.d.size = local_40;
      pDVar2 = local_58.d.d;
      if (local_40 != 0) {
        memcpy(local_58.d.ptr,(path->d).ptr + local_38,local_40 * 4);
      }
      local_58.d.d = pDVar2;
      if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,4,0x10);
        }
      }
    }
    pDVar2 = local_58.d.d;
    QVar6 = QDockAreaLayoutInfo::itemRect(this->docks + iVar1,&local_58);
    uVar5 = QVar6._8_8_;
    uVar4 = QVar6._0_8_;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
        QVar6.x2.m_i = (int)extraout_RDX;
        QVar6.y2.m_i = (int)((ulong)extraout_RDX >> 0x20);
        QVar6.x1.m_i = (int)uVar4;
        QVar6.y1.m_i = (int)((ulong)uVar4 >> 0x20);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar7.x2.m_i = (int)uVar5;
    QVar7.y2.m_i = (int)((ulong)uVar5 >> 0x20);
    QVar7.x1.m_i = (int)QVar6._0_8_;
    QVar7.y1.m_i = (int)((ulong)QVar6._0_8_ >> 0x20);
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayout::itemRect(const QList<int> &path) const
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    return docks[index].itemRect(path.mid(1));
}